

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hybrid_node.cpp
# Opt level: O2

void __thiscall
parallel_hybrid_node_none_false_Test::~parallel_hybrid_node_none_false_Test
          (parallel_hybrid_node_none_false_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(parallel_hybrid_node, none_false) {
  test_generator gen;
  auto root = gen.generate(
    "<bhvr_tree class = \"parallel_hybrid_node\" count = \"0\" expected = \"false\">"
      "<bhvr_tree class = \"true_node\"/>"
      "<bhvr_tree class = \"false_node\"/>"
      "<bhvr_tree class = \"true_node\"/>"
      "<bhvr_tree class = \"false_node\"/>"
    "</bhvr_tree>"
  );
  ASSERT_NE(nullptr, root);

  test_agent agent;
  EXPECT_EQ(0, agent.get_true_counter());
  EXPECT_EQ(0, agent.get_false_counter());

  test_agent_proxy ap(agent);
  root->exec(ap, [] (bool result, test_agent* agent) {
    EXPECT_FALSE(result);
    EXPECT_EQ(2, agent->get_true_counter());
    EXPECT_EQ(2, agent->get_false_counter());
  });
}